

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

QLayoutItem * __thiscall QDockWidgetLayout::itemAt(QDockWidgetLayout *this,int index)

{
  long lVar1;
  QLayoutItem *pQVar2;
  QLayoutItem *in_RAX;
  QLayoutItem *pQVar3;
  long lVar4;
  int iVar5;
  
  lVar1 = (this->item_list).d.size;
  if (lVar1 == 0) {
    return (QLayoutItem *)0x0;
  }
  lVar4 = 0;
  iVar5 = 0;
  while( true ) {
    pQVar2 = (this->item_list).d.ptr[lVar4];
    pQVar3 = in_RAX;
    if (iVar5 == index) {
      pQVar3 = pQVar2;
    }
    if (pQVar2 == (QLayoutItem *)0x0) {
      pQVar3 = in_RAX;
    }
    if (pQVar2 != (QLayoutItem *)0x0 && iVar5 == index) break;
    iVar5 = (iVar5 + 1) - (uint)(pQVar2 == (QLayoutItem *)0x0);
    lVar4 = lVar4 + 1;
    in_RAX = pQVar3;
    if (lVar1 == lVar4) {
      return (QLayoutItem *)0x0;
    }
  }
  return pQVar3;
}

Assistant:

QLayoutItem *QDockWidgetLayout::itemAt(int index) const
{
    int cnt = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        QLayoutItem *item = item_list.at(i);
        if (item == nullptr)
            continue;
        if (index == cnt++)
            return item;
    }
    return nullptr;
}